

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O2

void Handlers::Character_Request(Player *player,PacketReader *reader)

{
  allocator local_61;
  string local_60;
  PacketBuilder reply;
  
  PacketBuilder::PacketBuilder(&reply,PACKET_CHARACTER,PACKET_REPLY,4);
  PacketBuilder::AddShort(&reply,1000);
  std::__cxx11::string::string((string *)&local_60,"OK",&local_61);
  PacketBuilder::AddString(&reply,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  Player::Send(player,&reply);
  PacketBuilder::~PacketBuilder(&reply);
  return;
}

Assistant:

void Character_Request(Player *player, PacketReader &reader)
{
	(void)reader;

	PacketBuilder reply(PACKET_CHARACTER, PACKET_REPLY, 4);
	reply.AddShort(1000); // CreateID?
	reply.AddString("OK");

	player->Send(reply);
}